

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

int scalar_decode(scalar *out,uint8_t *in,int bits)

{
  int iVar1;
  int local_3c;
  int local_38;
  int chunk_bits;
  int element_bits_done;
  int iStack_2c;
  uint16_t element;
  int i;
  int in_byte_bits_left;
  uint8_t in_byte;
  byte *pbStack_20;
  int bits_local;
  uint8_t *in_local;
  scalar *out_local;
  
  if (0x10 < bits || bits == 1) {
    __assert_fail("bits <= (int)sizeof(*out->c) * 8 && bits != 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber.cc"
                  ,0x1c7,"int scalar_decode(scalar *, const uint8_t *, int)");
  }
  i._3_1_ = 0;
  iStack_2c = 0;
  element_bits_done = 0;
  pbStack_20 = in;
  while( true ) {
    if (0xff < element_bits_done) {
      return 1;
    }
    chunk_bits._2_2_ = 0;
    for (local_38 = 0; local_38 < bits; local_38 = local_3c + local_38) {
      if (iStack_2c == 0) {
        i._3_1_ = *pbStack_20;
        pbStack_20 = pbStack_20 + 1;
        iStack_2c = 8;
      }
      local_3c = bits - local_38;
      if (iStack_2c < local_3c) {
        local_3c = iStack_2c;
      }
      chunk_bits._2_2_ =
           chunk_bits._2_2_ | (ushort)(i._3_1_ & kMasks[local_3c + -1]) << ((byte)local_38 & 0x1f);
      iStack_2c = iStack_2c - local_3c;
      i._3_1_ = (byte)((int)(uint)i._3_1_ >> ((byte)local_3c & 0x1f));
    }
    iVar1 = constant_time_declassify_int((uint)(0xd00 < chunk_bits._2_2_));
    if (iVar1 != 0) break;
    out->c[element_bits_done] = chunk_bits._2_2_;
    element_bits_done = element_bits_done + 1;
  }
  return 0;
}

Assistant:

static int scalar_decode(scalar *out, const uint8_t *in, int bits) {
  assert(bits <= (int)sizeof(*out->c) * 8 && bits != 1);

  uint8_t in_byte = 0;
  int in_byte_bits_left = 0;

  for (int i = 0; i < DEGREE; i++) {
    uint16_t element = 0;
    int element_bits_done = 0;

    while (element_bits_done < bits) {
      if (in_byte_bits_left == 0) {
        in_byte = *in;
        in++;
        in_byte_bits_left = 8;
      }

      int chunk_bits = bits - element_bits_done;
      if (chunk_bits > in_byte_bits_left) {
        chunk_bits = in_byte_bits_left;
      }

      element |= (in_byte & kMasks[chunk_bits - 1]) << element_bits_done;
      in_byte_bits_left -= chunk_bits;
      in_byte >>= chunk_bits;

      element_bits_done += chunk_bits;
    }

    // An element is only out of range in the case of invalid input, in which
    // case it is okay to leak the comparison.
    if (constant_time_declassify_int(element >= kPrime)) {
      return 0;
    }
    out->c[i] = element;
  }

  return 1;
}